

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *vec)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pnVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  cpp_dec_float<50U,_int,_void> *v;
  int iVar11;
  int *piVar12;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pnVar6 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = (this->l).idx;
  piVar8 = (this->l).row;
  piVar9 = (this->l).start;
  iVar3 = (this->l).firstUpdate;
  lVar10 = (long)(this->l).firstUnused;
  while (iVar3 < lVar10) {
    lVar1 = lVar10 + -1;
    iVar4 = piVar9[lVar1];
    piVar12 = piVar7 + iVar4;
    iVar11 = piVar8[lVar1];
    local_a0.data._M_elems[0] = vec[iVar11].m_backend.data._M_elems[0];
    local_a0.data._M_elems[9] = vec[iVar11].m_backend.data._M_elems[9];
    puVar2 = vec[iVar11].m_backend.data._M_elems + 5;
    local_a0.data._M_elems._20_8_ = *(undefined8 *)puVar2;
    local_a0.data._M_elems._28_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = vec[iVar11].m_backend.data._M_elems + 1;
    local_a0.data._M_elems._4_8_ = *(undefined8 *)puVar2;
    local_a0.data._M_elems._12_8_ = *(undefined8 *)(puVar2 + 2);
    local_a0.exp = vec[iVar11].m_backend.exp;
    local_a0.fpclass = vec[iVar11].m_backend.fpclass;
    local_a0.prec_elem = vec[iVar11].m_backend.prec_elem;
    local_a0.neg = (bool)((local_a0.data._M_elems[0] != 0 ||
                          local_a0.fpclass != cpp_dec_float_finite) ^ vec[iVar11].m_backend.neg);
    v = &pnVar6[iVar4].m_backend;
    for (iVar11 = piVar9[lVar10]; iVar4 < iVar11; iVar11 = iVar11 + -1) {
      iVar5 = *piVar12;
      piVar12 = piVar12 + 1;
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_68,&vec[iVar5].m_backend,v);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_a0,&local_68);
      v = v + 1;
    }
    iVar4 = piVar8[lVar1];
    vec[iVar4].m_backend.data._M_elems[0] = local_a0.data._M_elems[0];
    puVar2 = vec[iVar4].m_backend.data._M_elems + 1;
    *(undefined8 *)puVar2 = local_a0.data._M_elems._4_8_;
    *(undefined8 *)(puVar2 + 2) = local_a0.data._M_elems._12_8_;
    puVar2 = vec[iVar4].m_backend.data._M_elems + 5;
    *(undefined8 *)puVar2 = local_a0.data._M_elems._20_8_;
    *(undefined8 *)(puVar2 + 2) = local_a0.data._M_elems._28_8_;
    vec[iVar4].m_backend.data._M_elems[9] = local_a0.data._M_elems[9];
    vec[iVar4].m_backend.exp = local_a0.exp;
    vec[iVar4].m_backend.neg =
         (bool)((local_a0.data._M_elems[0] != 0 || local_a0.fpclass != cpp_dec_float_finite) ^
               local_a0.neg);
    vec[iVar4].m_backend.fpclass = local_a0.fpclass;
    vec[iVar4].m_backend.prec_elem = local_a0.prec_elem;
    lVar10 = lVar1;
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUpdateLeft(R* vec)
{
   int i, j, k, end;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   assert(!l.updateType);               /* Forest-Tomlin Updates */

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      StableSum<R> tmp(-vec[lrow[i]]);

      for(j = lbeg[i + 1]; j > k; --j)
         tmp += vec[*idx++] * (*val++);

      vec[lrow[i]] = -R(tmp);
   }
}